

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O2

TimingControl *
slang::ast::DelayControl::fromSyntax
          (Compilation *compilation,DelaySyntax *syntax,ASTContext *context)

{
  bool bVar1;
  int iVar2;
  ExpressionSyntax *pEVar3;
  undefined4 extraout_var;
  DelayControl *ctrl;
  Type *pTVar4;
  Diagnostic *diag;
  TimingControl *pTVar5;
  SourceRange local_38;
  Expression *args;
  
  pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->delayValue);
  iVar2 = Expression::bind((int)pEVar3,(sockaddr *)context,0);
  args = (Expression *)CONCAT44(extraout_var,iVar2);
  local_38 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  ctrl = BumpAllocator::
         emplace<slang::ast::DelayControl,slang::ast::Expression_const&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,args,&local_38);
  bVar1 = Expression::bad(args);
  if (!bVar1) {
    pTVar4 = not_null<const_slang::ast::Type_*>::get(&args->type);
    bVar1 = Type::isNumeric(pTVar4);
    if (bVar1) {
      return &ctrl->super_TimingControl;
    }
    diag = ASTContext::addDiag(context,(DiagCode)0x100008,args->sourceRange);
    pTVar4 = not_null<const_slang::ast::Type_*>::get(&args->type);
    ast::operator<<(diag,pTVar4);
  }
  pTVar5 = TimingControl::badCtrl(compilation,&ctrl->super_TimingControl);
  return pTVar5;
}

Assistant:

TimingControl& DelayControl::fromSyntax(Compilation& compilation, const DelaySyntax& syntax,
                                        const ASTContext& context) {
    auto& expr = Expression::bind(*syntax.delayValue, context);
    auto result = compilation.emplace<DelayControl>(expr, syntax.sourceRange());
    if (expr.bad())
        return badCtrl(compilation, result);

    if (!expr.type->isNumeric()) {
        context.addDiag(diag::DelayNotNumeric, expr.sourceRange) << *expr.type;
        return badCtrl(compilation, result);
    }

    return *result;
}